

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcList_item *p)

{
  Table *pTVar1;
  long *in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  int iDb;
  char *zDb;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*in_RDX != 0) {
    sqlite3SchemaToIndex(*(sqlite3 **)in_RDI,(Schema *)*in_RDX);
  }
  pTVar1 = sqlite3LocateTable((Parse *)zDb,iDb,in_RDI,
                              (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse, 
  u32 flags,
  struct SrcList_item *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}